

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O3

void __thiscall ipx::Control::hIntervalLog(Control *this,stringstream *logging)

{
  HighsLogOptions *pHVar1;
  double dVar2;
  HighsLogOptions log_options_;
  undefined1 *local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  HighsInt *pHStack_60;
  _func_void_HighsLogType_char_ptr_void_ptr *local_58;
  void *pvStack_50;
  _Any_data local_48;
  _Manager_type local_38;
  void *local_28;
  bool local_20;
  
  if (0.0 <= (this->parameters_).super_ipx_parameters.print_interval) {
    dVar2 = Timer::Elapsed(&this->interval_);
    if ((this->parameters_).super_ipx_parameters.print_interval <= dVar2) {
      Timer::Reset(&this->interval_);
      if ((this->parameters_).super_ipx_parameters.highs_logging == true) {
        pHVar1 = (this->parameters_).super_ipx_parameters.log_options;
        local_78._0_8_ = pHVar1->log_stream;
        local_78._8_8_ = pHVar1->output_flag;
        local_78._16_8_ = pHVar1->log_to_console;
        pHStack_60 = pHVar1->log_dev_level;
        local_58 = pHVar1->user_log_callback;
        pvStack_50 = pHVar1->user_log_callback_data;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
                    *)&local_48,&pHVar1->user_callback);
        local_20 = pHVar1->user_callback_active;
        local_28 = pHVar1->user_callback_data;
        std::__cxx11::stringbuf::str();
        highsLogUser((HighsLogOptions *)local_78,kInfo,"%s",local_98);
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
        if (local_38 != (_Manager_type)0x0) {
          (*local_38)(&local_48,&local_48,__destroy_functor);
        }
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(this->output_).super_ostream,(char *)local_78._0_8_,local_78._8_8_);
        if ((FILE *)local_78._0_8_ != (FILE *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_);
        }
      }
    }
  }
  local_78._8_8_ = (bool *)0x0;
  local_78._16_8_ = local_78._16_8_ & 0xffffffffffffff00;
  local_78._0_8_ = (FILE *)(local_78 + 0x10);
  std::__cxx11::stringbuf::str((string *)(logging + 0x18));
  if ((FILE *)local_78._0_8_ != (FILE *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_);
  }
  return;
}

Assistant:

void Control::hIntervalLog(std::stringstream& logging) const {
  if (parameters_.print_interval >= 0.0 &&
      interval_.Elapsed() >= parameters_.print_interval) {
    interval_.Reset();
    if (parameters_.highs_logging) {
      assert(parameters_.log_options);
      HighsLogOptions log_options_ = *(parameters_.log_options);
      highsLogUser(log_options_, HighsLogType::kInfo, "%s", logging.str().c_str());
    } else {
      output_ << logging.str();
    }
  }
  logging.str(std::string());
}